

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCore.c
# Opt level: O2

void Cec_ManChcSetDefaultParams(Cec_ParChc_t *p)

{
  p->nWords = 0xf;
  p->nRounds = 0xf;
  p->nBTLimit = 1000;
  p->fUseRings = 1;
  p->fUseCSat = 0;
  p->fVeryVerbose = 0;
  p->fVerbose = 0;
  return;
}

Assistant:

void Cec_ManChcSetDefaultParams( Cec_ParChc_t * p )
{
    memset( p, 0, sizeof(Cec_ParChc_t) );
    p->nWords         =      15;  // the number of simulation words
    p->nRounds        =      15;  // the number of simulation rounds
    p->nBTLimit       =    1000;  // conflict limit at a node
    p->fUseRings      =       1;  // use rings
    p->fUseCSat       =       0;  // use circuit-based solver
    p->fVeryVerbose   =       0;  // verbose stats
    p->fVerbose       =       0;  // verbose stats
}